

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  bool bVar1;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  string local_298;
  string local_278;
  string local_258;
  AlphaNum local_238;
  AlphaNum local_208;
  string local_1d8;
  AlphaNum local_1b8;
  AlphaNum local_188;
  string local_158;
  AlphaNum local_138;
  string local_108;
  string local_e8;
  AlphaNum local_c8;
  AlphaNum local_98;
  AlphaNum local_68;
  string local_38;
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_18;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldGeneratorBase *this_local;
  
  local_18 = (raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)variables;
  variables_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)this;
  oneof_name_abi_cxx11_(&local_38,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_18,(key_arg<char[11]> *)0x62ad57);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = SupportsPresenceApi(this->descriptor_);
  if (bVar1) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_98,"Has");
    property_name_abi_cxx11_(&local_e8,this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_c8,&local_e8);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_68,&local_98);
    pbVar2 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_18,(key_arg<char[19]> *)0x636110);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    oneof_name_abi_cxx11_(&local_158,this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_138,&local_158);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_188,"Case_ == ");
    oneof_property_name_abi_cxx11_(&local_1d8,this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1b8,&local_1d8);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_208,"OneofCase.");
    oneof_case_name_abi_cxx11_(&local_258,this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_238,&local_258);
    absl::lts_20240722::StrCat<>(&local_108,&local_138,&local_188,&local_1b8,&local_208,&local_238);
    pbVar2 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_18,(key_arg<char[19]> *)0x636110);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_158);
  }
  oneof_case_name_abi_cxx11_(&local_278,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[16],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_18,(key_arg<char[16]> *)"oneof_case_name");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  oneof_property_name_abi_cxx11_(&local_298,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[20],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_18,(key_arg<char[20]> *)"oneof_property_name");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = absl::StrCat("Has", property_name());
  } else {
    (*variables)["has_property_check"] =
        absl::StrCat(oneof_name(), "Case_ == ", oneof_property_name(),
                     "OneofCase.", oneof_case_name());
  }
  (*variables)["oneof_case_name"] = oneof_case_name();
  (*variables)["oneof_property_name"] = oneof_property_name();
}